

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group_Type.cxx
# Opt level: O0

void __thiscall Fluid_Table::Fluid_Table(Fluid_Table *this,int x,int y,int w,int h,char *l)

{
  int local_30;
  int local_2c;
  int c;
  int r;
  char *l_local;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  Fluid_Table *this_local;
  
  Fl_Table::Fl_Table(&this->super_Fl_Table,x,y,w,h,l);
  (this->super_Fl_Table).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget =
       (_func_int **)&PTR__Fluid_Table_002e61a8;
  for (local_2c = 0; local_2c < 0xe; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < 7; local_30 = local_30 + 1) {
      this->data[local_2c][local_30] = local_2c * 1000 + 1000 + local_30;
    }
  }
  (*(this->super_Fl_Table).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[0xc])(this,0xe);
  Fl_Table::row_header(&this->super_Fl_Table,1);
  Fl_Table::row_height_all(&this->super_Fl_Table,0x14);
  Fl_Table::row_resize(&this->super_Fl_Table,0);
  (*(this->super_Fl_Table).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[0xd])(this,7);
  Fl_Table::col_header(&this->super_Fl_Table,1);
  Fl_Table::col_width_all(&this->super_Fl_Table,0x50);
  Fl_Table::col_resize(&this->super_Fl_Table,1);
  return;
}

Assistant:

Fluid_Table(int x, int y, int w, int h, const char *l=0L)
  : Fl_Table(x, y, w, h, l) {
    for ( int r=0; r<MAX_ROWS; r++ )
      for ( int c=0; c<MAX_COLS; c++ )
        data[r][c] = 1000+(r*1000)+c;
    // Rows
    rows(MAX_ROWS);             // how many rows
    row_header(1);              // enable row headers (along left)
    row_height_all(20);         // default height of rows
    row_resize(0);              // disable row resizing                                // Cols
    cols(MAX_COLS);             // how many columns
    col_header(1);              // enable column headers (along top)
    col_width_all(80);          // default width of columns
    col_resize(1);              // enable column resizing
  }